

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

UConverter *
ucnv_safeClone_63(UConverter *cnv,void *stackBuffer,int32_t *pBufferSize,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode UVar2;
  uint8_t *puVar3;
  undefined2 local_c8;
  undefined1 local_c6;
  int32_t offsetUp;
  UConverterFromUnicodeArgs fromUArgs;
  UConverterToUnicodeArgs toUArgs;
  UConverter *pUStack_50;
  UErrorCode cbErr;
  char *stackBufferChars;
  int32_t bufferSizeNeeded;
  int32_t stackBufferSize;
  UConverter *allocatedConverter;
  UConverter *localConverter;
  UErrorCode *status_local;
  int32_t *pBufferSize_local;
  void *stackBuffer_local;
  UConverter *cnv_local;
  
  localConverter = (UConverter *)status;
  status_local = pBufferSize;
  pBufferSize_local = (int32_t *)stackBuffer;
  stackBuffer_local = cnv;
  memset(&fromUArgs.offsets,0,0x38);
  fromUArgs.offsets._0_2_ = 0x38;
  fromUArgs.offsets._2_1_ = 1;
  memset(&local_c8,0,0x38);
  local_c8 = 0x38;
  local_c6 = 1;
  if ((localConverter == (UConverter *)0x0) ||
     (UVar1 = U_FAILURE(*(UErrorCode *)&localConverter->fromUCharErrorBehaviour), UVar1 != '\0')) {
    cnv_local = (UConverter *)0x0;
  }
  else if (stackBuffer_local == (void *)0x0) {
    *(undefined4 *)&localConverter->fromUCharErrorBehaviour = 1;
    cnv_local = (UConverter *)0x0;
  }
  else {
    if (*(long *)(*(long *)(*(long *)((long)stackBuffer_local + 0x30) + 0x20) + 0x70) == 0) {
      stackBufferChars._0_4_ = 0x120;
    }
    else {
      stackBufferChars._0_4_ = U_ZERO_ERROR;
      (**(code **)(*(long *)(*(long *)((long)stackBuffer_local + 0x30) + 0x20) + 0x70))
                (stackBuffer_local,0,&stackBufferChars,localConverter);
      UVar1 = U_FAILURE(*(UErrorCode *)&localConverter->fromUCharErrorBehaviour);
      if (UVar1 != '\0') {
        return (UConverter *)0x0;
      }
    }
    if (status_local == (UErrorCode *)0x0) {
      stackBufferChars._4_4_ = U_ILLEGAL_ARGUMENT_ERROR;
      status_local = (UErrorCode *)((long)&stackBufferChars + 4);
    }
    else {
      stackBufferChars._4_4_ = *status_local;
      if (stackBufferChars._4_4_ < U_ILLEGAL_ARGUMENT_ERROR) {
        *status_local = (UErrorCode)stackBufferChars;
        return (UConverter *)0x0;
      }
    }
    pUStack_50 = (UConverter *)stackBuffer;
    if (((ulong)pBufferSize_local & 7) != 0) {
      UVar2 = U_INDEX_OUTOFBOUNDS_ERROR - ((uint)stackBuffer & 7);
      if (UVar2 < stackBufferChars._4_4_) {
        stackBufferChars._4_4_ = stackBufferChars._4_4_ - UVar2;
        pUStack_50 = (UConverter *)((long)stackBuffer + (long)UVar2);
      }
      else {
        stackBufferChars._4_4_ = U_ILLEGAL_ARGUMENT_ERROR;
      }
    }
    pBufferSize_local = (int32_t *)pUStack_50;
    if ((stackBufferChars._4_4_ < (UErrorCode)stackBufferChars) || (pUStack_50 == (UConverter *)0x0)
       ) {
      _bufferSizeNeeded = (UConverter *)uprv_malloc_63((long)(UErrorCode)stackBufferChars);
      if (_bufferSizeNeeded == (UConverter *)0x0) {
        *(undefined4 *)&localConverter->fromUCharErrorBehaviour = 7;
        return (UConverter *)0x0;
      }
      *(undefined4 *)&localConverter->fromUCharErrorBehaviour = 0xffffff82;
      allocatedConverter = _bufferSizeNeeded;
      *status_local = (UErrorCode)stackBufferChars;
    }
    else {
      allocatedConverter = pUStack_50;
      _bufferSizeNeeded = (UConverter *)0x0;
    }
    memset(allocatedConverter,0,(long)(UErrorCode)stackBufferChars);
    memcpy(allocatedConverter,stackBuffer_local,0x120);
    allocatedConverter->isExtraLocal = '\0';
    allocatedConverter->isCopyLocal = '\0';
    if (*(long *)((long)stackBuffer_local + 0x28) == (long)stackBuffer_local + 0x88) {
      allocatedConverter->subChars = (uint8_t *)allocatedConverter->subUChars;
    }
    else {
      puVar3 = (uint8_t *)uprv_malloc_63(0x40);
      allocatedConverter->subChars = puVar3;
      if (allocatedConverter->subChars == (uint8_t *)0x0) {
        uprv_free_63(_bufferSizeNeeded);
        return (UConverter *)0x0;
      }
      memcpy(allocatedConverter->subChars,*(void **)((long)stackBuffer_local + 0x28),0x40);
    }
    if (*(long *)(*(long *)(*(long *)((long)stackBuffer_local + 0x30) + 0x20) + 0x70) != 0) {
      allocatedConverter =
           (UConverter *)
           (**(code **)(*(long *)(*(long *)((long)stackBuffer_local + 0x30) + 0x20) + 0x70))
                     (stackBuffer_local,allocatedConverter,status_local,localConverter);
    }
    if ((allocatedConverter == (UConverter *)0x0) ||
       (UVar1 = U_FAILURE(*(UErrorCode *)&localConverter->fromUCharErrorBehaviour), UVar1 != '\0'))
    {
      if ((_bufferSizeNeeded != (UConverter *)0x0) &&
         ((UChar *)_bufferSizeNeeded->subChars != _bufferSizeNeeded->subUChars)) {
        uprv_free_63(_bufferSizeNeeded->subChars);
      }
      uprv_free_63(_bufferSizeNeeded);
      cnv_local = (UConverter *)0x0;
    }
    else {
      if (*(char *)(*(long *)((long)stackBuffer_local + 0x30) + 0x19) != '\0') {
        ucnv_incrementRefCount_63(*(UConverterSharedData **)((long)stackBuffer_local + 0x30));
      }
      if (allocatedConverter == (UConverter *)pBufferSize_local) {
        allocatedConverter->isCopyLocal = '\x01';
      }
      fromUArgs._0_8_ = allocatedConverter;
      toUArgs._0_8_ = allocatedConverter;
      toUArgs.offsets._4_4_ = 0;
      (**(code **)((long)stackBuffer_local + 8))
                (*(undefined8 *)((long)stackBuffer_local + 0x20),&fromUArgs.offsets,0,0,5,
                 (undefined1 *)((long)&toUArgs.offsets + 4));
      toUArgs.offsets._4_4_ = 0;
      (**stackBuffer_local)
                (*(undefined8 *)((long)stackBuffer_local + 0x18),&local_c8,0,0,0,5,
                 (undefined1 *)((long)&toUArgs.offsets + 4));
      cnv_local = allocatedConverter;
    }
  }
  return cnv_local;
}

Assistant:

U_CAPI UConverter* U_EXPORT2
ucnv_safeClone(const UConverter* cnv, void *stackBuffer, int32_t *pBufferSize, UErrorCode *status)
{
    UConverter *localConverter, *allocatedConverter;
    int32_t stackBufferSize;
    int32_t bufferSizeNeeded;
    char *stackBufferChars = (char *)stackBuffer;
    UErrorCode cbErr;
    UConverterToUnicodeArgs toUArgs = {
        sizeof(UConverterToUnicodeArgs),
            TRUE,
            NULL,
            NULL,
            NULL,
            NULL,
            NULL,
            NULL
    };
    UConverterFromUnicodeArgs fromUArgs = {
        sizeof(UConverterFromUnicodeArgs),
            TRUE,
            NULL,
            NULL,
            NULL,
            NULL,
            NULL,
            NULL
    };

    UTRACE_ENTRY_OC(UTRACE_UCNV_CLONE);

    if (status == NULL || U_FAILURE(*status)){
        UTRACE_EXIT_STATUS(status? *status: U_ILLEGAL_ARGUMENT_ERROR);
        return NULL;
    }

    if (cnv == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        UTRACE_EXIT_STATUS(*status);
        return NULL;
    }

    UTRACE_DATA3(UTRACE_OPEN_CLOSE, "clone converter %s at %p into stackBuffer %p",
                                    ucnv_getName(cnv, status), cnv, stackBuffer);

    if (cnv->sharedData->impl->safeClone != NULL) {
        /* call the custom safeClone function for sizing */
        bufferSizeNeeded = 0;
        cnv->sharedData->impl->safeClone(cnv, NULL, &bufferSizeNeeded, status);
        if (U_FAILURE(*status)) {
            UTRACE_EXIT_STATUS(*status);
            return NULL;
        }
    }
    else
    {
        /* inherent sizing */
        bufferSizeNeeded = sizeof(UConverter);
    }

    if (pBufferSize == NULL) {
        stackBufferSize = 1;
        pBufferSize = &stackBufferSize;
    } else {
        stackBufferSize = *pBufferSize;
        if (stackBufferSize <= 0){ /* 'preflighting' request - set needed size into *pBufferSize */
            *pBufferSize = bufferSizeNeeded;
            UTRACE_EXIT_VALUE(bufferSizeNeeded);
            return NULL;
        }
    }


    /* Pointers on 64-bit platforms need to be aligned
     * on a 64-bit boundary in memory.
     */
    if (U_ALIGNMENT_OFFSET(stackBuffer) != 0) {
        int32_t offsetUp = (int32_t)U_ALIGNMENT_OFFSET_UP(stackBufferChars);
        if(stackBufferSize > offsetUp) {
            stackBufferSize -= offsetUp;
            stackBufferChars += offsetUp;
        } else {
            /* prevent using the stack buffer but keep the size > 0 so that we do not just preflight */
            stackBufferSize = 1;
        }
    }

    stackBuffer = (void *)stackBufferChars;
    
    /* Now, see if we must allocate any memory */
    if (stackBufferSize < bufferSizeNeeded || stackBuffer == NULL)
    {
        /* allocate one here...*/
        localConverter = allocatedConverter = (UConverter *) uprv_malloc (bufferSizeNeeded);

        if(localConverter == NULL) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            UTRACE_EXIT_STATUS(*status);
            return NULL;
        }
        *status = U_SAFECLONE_ALLOCATED_WARNING;

        /* record the fact that memory was allocated */
        *pBufferSize = bufferSizeNeeded;
    } else {
        /* just use the stack buffer */
        localConverter = (UConverter*) stackBuffer;
        allocatedConverter = NULL;
    }

    uprv_memset(localConverter, 0, bufferSizeNeeded);

    /* Copy initial state */
    uprv_memcpy(localConverter, cnv, sizeof(UConverter));
    localConverter->isCopyLocal = localConverter->isExtraLocal = FALSE;

    /* copy the substitution string */
    if (cnv->subChars == (uint8_t *)cnv->subUChars) {
        localConverter->subChars = (uint8_t *)localConverter->subUChars;
    } else {
        localConverter->subChars = (uint8_t *)uprv_malloc(UCNV_ERROR_BUFFER_LENGTH * U_SIZEOF_UCHAR);
        if (localConverter->subChars == NULL) {
            uprv_free(allocatedConverter);
            UTRACE_EXIT_STATUS(*status);
            return NULL;
        }
        uprv_memcpy(localConverter->subChars, cnv->subChars, UCNV_ERROR_BUFFER_LENGTH * U_SIZEOF_UCHAR);
    }

    /* now either call the safeclone fcn or not */
    if (cnv->sharedData->impl->safeClone != NULL) {
        /* call the custom safeClone function */
        localConverter = cnv->sharedData->impl->safeClone(cnv, localConverter, pBufferSize, status);
    }

    if(localConverter==NULL || U_FAILURE(*status)) {
        if (allocatedConverter != NULL && allocatedConverter->subChars != (uint8_t *)allocatedConverter->subUChars) {
            uprv_free(allocatedConverter->subChars);
        }
        uprv_free(allocatedConverter);
        UTRACE_EXIT_STATUS(*status);
        return NULL;
    }

    /* increment refcount of shared data if needed */
    if (cnv->sharedData->isReferenceCounted) {
        ucnv_incrementRefCount(cnv->sharedData);
    }

    if(localConverter == (UConverter*)stackBuffer) {
        /* we're using user provided data - set to not destroy */
        localConverter->isCopyLocal = TRUE;
    }

    /* allow callback functions to handle any memory allocation */
    toUArgs.converter = fromUArgs.converter = localConverter;
    cbErr = U_ZERO_ERROR;
    cnv->fromCharErrorBehaviour(cnv->toUContext, &toUArgs, NULL, 0, UCNV_CLONE, &cbErr);
    cbErr = U_ZERO_ERROR;
    cnv->fromUCharErrorBehaviour(cnv->fromUContext, &fromUArgs, NULL, 0, 0, UCNV_CLONE, &cbErr);

    UTRACE_EXIT_PTR_STATUS(localConverter, *status);
    return localConverter;
}